

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O2

BYTE * find_central_dir(FILE *fin)

{
  int iVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  int *__ptr;
  uint uVar6;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  EndOfCentralDirectory eod;
  uchar buf [1028];
  ulong uVar7;
  
  fseek((FILE *)fin,0,2);
  lVar3 = ftell((FILE *)fin);
  lVar9 = 0xffff;
  if (lVar3 < 0xffff) {
    lVar9 = lVar3;
  }
  iVar2 = (int)lVar3;
  lVar8 = 4;
  do {
    if (lVar9 <= lVar8) {
      return (BYTE *)0x0;
    }
    lVar10 = lVar8 + 0x400;
    lVar8 = lVar9;
    if (lVar10 < lVar9) {
      lVar8 = lVar10;
    }
    uVar7 = (ulong)(uint)(iVar2 - (int)lVar8);
    uVar11 = lVar3 - uVar7;
    if (0x403 < (long)uVar11) {
      uVar11 = 0x404;
    }
    iVar1 = fseek((FILE *)fin,uVar7,0);
    if (iVar1 != 0) {
      return (BYTE *)0x0;
    }
    sVar4 = fread(buf,1,uVar11 & 0xffffffff,(FILE *)fin);
    if (sVar4 != (uVar11 & 0xffffffff)) {
      return (BYTE *)0x0;
    }
    uVar6 = (int)uVar11 - 3;
    uVar7 = (ulong)uVar6;
    for (lVar5 = 0; iVar1 = (int)lVar5, 0 < (int)(uVar6 + iVar1); lVar5 = lVar5 + -1) {
      if ((((buf[lVar5 + uVar7 + -1] == 'P') && (buf[lVar5 + uVar7] == 'K')) &&
          (buf[lVar5 + uVar7 + 1] == '\x05')) && (buf[lVar5 + uVar7 + 2] == '\x06')) {
        if (iVar1 + (((int)uVar11 + iVar2 + -4) - (int)lVar8) != 0) {
          if (lVar3 < lVar10) {
            lVar10 = lVar3;
          }
          if (0xfffe < lVar10) {
            lVar10 = 0xffff;
          }
          lVar3 = lVar3 - (ulong)(uint)(iVar2 - (int)lVar10);
          if (0x403 < lVar3) {
            lVar3 = 0x404;
          }
          iVar2 = fseek((FILE *)fin,(ulong)(((((int)lVar3 + iVar2) - (int)lVar10) + iVar1) - 4),0);
          if (iVar2 != 0) {
            return (BYTE *)0x0;
          }
          sVar4 = fread(&eod,0x16,1,(FILE *)fin);
          if (sVar4 != 1) {
            return (BYTE *)0x0;
          }
          iVar2 = fseek((FILE *)fin,(ulong)eod.DirectoryOffset,0);
          if (iVar2 == 0) {
            uVar7 = (ulong)eod.DirectorySize;
            __ptr = (int *)malloc((ulong)(eod.DirectorySize + 4));
            if (__ptr == (int *)0x0) {
              no_mem = 1;
              return (BYTE *)0x0;
            }
            sVar4 = fread(__ptr,1,uVar7,(FILE *)fin);
            if ((sVar4 == uVar7) && (*__ptr == 0x2014b50)) {
              *(undefined4 *)((long)__ptr + uVar7) = 0x6054b50;
              return (BYTE *)__ptr;
            }
            free(__ptr);
            return (BYTE *)0x0;
          }
          return (BYTE *)0x0;
        }
        break;
      }
    }
  } while( true );
}

Assistant:

BYTE *find_central_dir(FILE *fin)
{
	unsigned char buf[BUFREADCOMMENT + 4];
	EndOfCentralDirectory eod;
	BYTE *dir;
	long file_size;
	long back_read;
	long max_back;		// maximum size of global comment
	long pos_found = 0;

	fseek(fin, 0, SEEK_END);

	file_size = ftell(fin);
	max_back = 0xffff > file_size ? file_size : 0xffff;

	back_read = 4;
	while (back_read < max_back)
	{
		UINT32 read_size, read_pos;
		int i;
		if (back_read + BUFREADCOMMENT > max_back) 
			back_read = max_back;
		else
			back_read += BUFREADCOMMENT;
		read_pos = file_size - back_read;

		read_size = (BUFREADCOMMENT + 4) < (file_size - read_pos) ?
					(BUFREADCOMMENT + 4) : (file_size - read_pos);

		if (fseek(fin, read_pos, SEEK_SET) != 0)
			return NULL;

		if (fread(buf, 1, read_size, fin) != read_size)
			return NULL;

		for (i = (int)read_size - 3; (i--) > 0;)
		{
			if (buf[i] == 'P' && buf[i+1] == 'K' && buf[i+2] == 5 && buf[i+3] == 6)
			{
				pos_found = read_pos + i;
				break;
			}
		}

		if (pos_found != 0)
			break;
	}
	if (pos_found == 0 ||
		fseek(fin, pos_found, SEEK_SET) != 0 ||
		fread(&eod, sizeof(eod), 1, fin) != 1 ||
		fseek(fin, LittleLong(eod.DirectoryOffset), SEEK_SET) != 0)
	{
		return NULL;
	}
	dir = malloc(LittleLong(eod.DirectorySize) + 4);
	if (dir == NULL)
	{
		no_mem = 1;
		return NULL;
	}
	if (fread(dir, 1, LittleLong(eod.DirectorySize), fin) != LittleLong(eod.DirectorySize))
	{
		free(dir);
		return NULL;
	}
	if (memcmp(dir, (const BYTE *)&centralfile, sizeof(UINT32)) != 0)
	{
		free(dir);
		return NULL;
	}
	memcpy(dir + LittleLong(eod.DirectorySize), (const BYTE *)&endofdir, sizeof(UINT32));
	return dir;
}